

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O2

void av1_save_all_coding_context(AV1_COMP *cpi)

{
  bool bVar1;
  AV1_PRIMARY *pAVar2;
  int *piVar3;
  RefCntBuffer *pRVar4;
  byte bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  int8_t iVar11;
  int8_t iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  MV_STATS *pMVar18;
  MV_STATS *pMVar19;
  bool bVar20;
  byte bVar21;
  
  bVar21 = 0;
  uVar6 = *(undefined8 *)(cpi->common).lf.filter_level;
  iVar14 = (cpi->common).lf.filter_level_u;
  iVar15 = (cpi->common).lf.filter_level_v;
  uVar7 = *(undefined8 *)(cpi->common).lf.backup_filter_level;
  iVar16 = (cpi->common).lf.backup_filter_level_u;
  iVar13 = (cpi->common).lf.backup_filter_level_v;
  uVar9 = (cpi->common).lf.mode_ref_delta_enabled;
  uVar10 = (cpi->common).lf.mode_ref_delta_update;
  iVar11 = (cpi->common).lf.ref_deltas[0];
  iVar12 = (cpi->common).lf.ref_deltas[1];
  uVar8 = *(undefined8 *)((cpi->common).lf.ref_deltas + 2);
  (cpi->coding_context).lf.sharpness_level = (cpi->common).lf.sharpness_level;
  (cpi->coding_context).lf.mode_ref_delta_enabled = uVar9;
  (cpi->coding_context).lf.mode_ref_delta_update = uVar10;
  (cpi->coding_context).lf.ref_deltas[0] = iVar11;
  (cpi->coding_context).lf.ref_deltas[1] = iVar12;
  *(undefined8 *)((cpi->coding_context).lf.ref_deltas + 2) = uVar8;
  *(undefined8 *)(cpi->coding_context).lf.backup_filter_level = uVar7;
  (cpi->coding_context).lf.backup_filter_level_u = iVar16;
  (cpi->coding_context).lf.backup_filter_level_v = iVar13;
  *(undefined8 *)(cpi->coding_context).lf.filter_level = uVar6;
  (cpi->coding_context).lf.filter_level_u = iVar14;
  (cpi->coding_context).lf.filter_level_v = iVar15;
  memcpy(&(cpi->coding_context).cdef_info,&(cpi->common).cdef_info,0x108);
  memcpy(&(cpi->coding_context).rc,&cpi->rc,0x140);
  pAVar2 = cpi->ppi;
  pMVar18 = &pAVar2->mv_stats;
  pMVar19 = &(cpi->coding_context).mv_stats;
  for (lVar17 = 0x4c; lVar17 != 0; lVar17 = lVar17 + -1) {
    *(char *)&pMVar19->high_prec = (char)pMVar18->high_prec;
    pMVar18 = (MV_STATS *)((long)pMVar18 + (ulong)bVar21 * -2 + 1);
    pMVar19 = (MV_STATS *)((long)pMVar19 + (ulong)bVar21 * -2 + 1);
  }
  if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
    bVar1 = (cpi->refresh_frame).golden_frame;
    bVar21 = 1;
    for (lVar17 = 0x85a7; lVar17 != 0x85ae; lVar17 = lVar17 + 1) {
      piVar3 = *(int **)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar17 * 8);
      if (lVar17 == 0x85aa) {
        iVar16 = is_one_pass_rt_params(cpi);
        if (((iVar16 == 0) || (pAVar2->use_svc != 0)) || (piVar3 == (int *)0x0)) {
          bVar5 = 1;
          if (!(bool)(~bVar21 & 1 | piVar3 == (int *)0x0)) goto LAB_001b4395;
          bVar21 = piVar3 == (int *)0x0 & bVar21;
        }
        else {
          pRVar4 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[3]];
          if (piVar3[0x13c] == (pRVar4->buf).field_2.field_0.y_crop_width) {
            bVar20 = piVar3[0x13e] == (pRVar4->buf).field_3.field_0.y_crop_height;
          }
          else {
            bVar20 = false;
          }
          bVar5 = 1;
          if ((bVar1 != false) || (bVar20)) {
LAB_001b4395:
            *piVar3 = *piVar3 + -1;
            *(undefined8 *)
             ((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar17 * 8) = 0;
            bVar21 = bVar5;
          }
          else {
            bVar21 = 0;
          }
        }
      }
      else {
        bVar5 = bVar21;
        if (piVar3 != (int *)0x0) goto LAB_001b4395;
      }
    }
  }
  return;
}

Assistant:

void av1_save_all_coding_context(AV1_COMP *cpi) {
  save_extra_coding_context(cpi);
  if (!frame_is_intra_only(&cpi->common)) release_scaled_references(cpi);
}